

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void zap_stdio(void)

{
  int __fd;
  
  __fd = open("/dev/null",2);
  dup2(__fd,0);
  dup2(__fd,1);
  dup2(__fd,2);
  close(__fd);
  return;
}

Assistant:

static void zap_stdio(void)
{
    int fd;
    fd = open("/dev/null", O_RDWR);
    dup2(fd, 0);
    dup2(fd, 1);
    dup2(fd, 2);
    close(fd);
}